

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_12_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  float *data;
  float *pfVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  int k_count;
  long lVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  float *pfVar62;
  float *pfVar63;
  int iVar64;
  float *pfVar65;
  long lVar66;
  long lVar67;
  ulong uVar68;
  int iVar69;
  long lVar70;
  int scale;
  long lVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  bool bVar77;
  byte bVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  undefined1 auVar123 [12];
  undefined1 auVar122 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar124 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar127;
  undefined1 auVar128 [64];
  int data_width;
  int c2;
  int local_200;
  float local_118;
  
  auVar87._8_4_ = 0x3effffff;
  auVar87._0_8_ = 0x3effffff3effffff;
  auVar87._12_4_ = 0x3effffff;
  auVar121 = ZEXT1664(auVar87);
  auVar86._8_4_ = 0x80000000;
  auVar86._0_8_ = 0x8000000080000000;
  auVar86._12_4_ = 0x80000000;
  fVar94 = ipoint->scale;
  auVar128 = ZEXT464((uint)fVar94);
  auVar79 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)fVar94),auVar86,0xf8);
  auVar79 = ZEXT416((uint)(fVar94 + auVar79._0_4_));
  auVar79 = vroundss_avx(auVar79,auVar79,0xb);
  fVar92 = -0.08 / (fVar94 * fVar94);
  scale = (int)auVar79._0_4_;
  auVar80._0_4_ = (int)auVar79._0_4_;
  auVar80._4_4_ = (int)auVar79._4_4_;
  auVar80._8_4_ = (int)auVar79._8_4_;
  auVar80._12_4_ = (int)auVar79._12_4_;
  auVar79 = vcvtdq2ps_avx(auVar80);
  auVar80 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)ipoint->x),auVar86,0xf8);
  auVar80 = ZEXT416((uint)(ipoint->x + auVar80._0_4_));
  auVar80 = vroundss_avx(auVar80,auVar80,0xb);
  auVar81._0_8_ = (double)auVar80._0_4_;
  auVar81._8_8_ = auVar80._8_8_;
  auVar85._0_8_ = (double)fVar94;
  auVar85._8_8_ = 0;
  auVar80 = vfmadd231sd_fma(auVar81,auVar85,ZEXT816(0x3fe0000000000000));
  auVar84._0_4_ = (float)auVar80._0_8_;
  auVar84._4_12_ = auVar80._4_12_;
  auVar80 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)ipoint->y),auVar86,0xf8);
  fVar3 = auVar84._0_4_ - auVar79._0_4_;
  auVar80 = ZEXT416((uint)(ipoint->y + auVar80._0_4_));
  auVar80 = vroundss_avx(auVar80,auVar80,0xb);
  auVar81 = ZEXT416((uint)fVar3);
  auVar82._0_8_ = (double)auVar80._0_4_;
  auVar82._8_8_ = auVar80._8_8_;
  auVar80 = vfmadd231sd_fma(auVar82,auVar85,ZEXT816(0x3fe0000000000000));
  auVar83._0_4_ = (float)auVar80._0_8_;
  auVar83._4_12_ = auVar80._4_12_;
  fVar127 = auVar83._0_4_ - auVar79._0_4_;
  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar94),auVar84);
  auVar80 = vpternlogd_avx512vl(auVar87,auVar79,auVar86,0xf8);
  auVar79 = ZEXT416((uint)(auVar79._0_4_ + auVar80._0_4_));
  auVar79 = vroundss_avx(auVar79,auVar79,0xb);
  if (scale < (int)auVar79._0_4_) {
    auVar88._8_4_ = 0x3effffff;
    auVar88._0_8_ = 0x3effffff3effffff;
    auVar88._12_4_ = 0x3effffff;
    auVar89._8_4_ = 0x80000000;
    auVar89._0_8_ = 0x8000000080000000;
    auVar89._12_4_ = 0x80000000;
    auVar82 = ZEXT416((uint)fVar94);
    auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar82,auVar83);
    auVar80 = vpternlogd_avx512vl(auVar89,auVar79,auVar88,0xea);
    auVar79 = ZEXT416((uint)(auVar79._0_4_ + auVar80._0_4_));
    auVar79 = vroundss_avx(auVar79,auVar79,0xb);
    if (scale < (int)auVar79._0_4_) {
      auVar79 = vfmadd231ss_fma(auVar84,auVar82,ZEXT416(0x41300000));
      auVar90._8_4_ = 0x80000000;
      auVar90._0_8_ = 0x8000000080000000;
      auVar90._12_4_ = 0x80000000;
      auVar80 = vpternlogd_avx512vl(auVar90,auVar79,auVar88,0xea);
      auVar79 = ZEXT416((uint)(auVar79._0_4_ + auVar80._0_4_));
      auVar79 = vroundss_avx(auVar79,auVar79,0xb);
      if ((int)auVar79._0_4_ + scale <= iimage->width) {
        auVar79 = vfmadd231ss_fma(auVar83,auVar82,ZEXT416(0x41300000));
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar80 = vpternlogd_avx512vl(auVar88,auVar79,auVar11,0xf8);
        auVar79 = ZEXT416((uint)(auVar79._0_4_ + auVar80._0_4_));
        auVar79 = vroundss_avx(auVar79,auVar79,0xb);
        if ((int)auVar79._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar63 = iimage->data;
          iVar20 = scale * 2;
          fVar3 = fVar3 + 0.5;
          pfVar65 = haarResponseY + 0x23;
          pfVar62 = haarResponseX + 0x23;
          uVar21 = 0xfffffff4;
          do {
            auVar79._0_4_ = (float)(int)uVar21;
            auVar79._4_12_ = in_ZMM8._4_12_;
            lVar34 = 0;
            auVar113._0_4_ = (float)(int)(uVar21 | 1);
            auVar113._4_12_ = in_ZMM8._4_12_;
            auVar79 = vfmadd213ss_fma(auVar79,auVar82,ZEXT416((uint)(fVar127 + 0.5)));
            auVar80 = vfmadd213ss_fma(auVar113,auVar82,ZEXT416((uint)(fVar127 + 0.5)));
            iVar16 = (int)auVar79._0_4_;
            iVar19 = (int)auVar80._0_4_;
            iVar17 = (iVar16 + -1) * iVar1;
            iVar18 = (iVar16 + -1 + scale) * iVar1;
            iVar25 = (iVar16 + -1 + iVar20) * iVar1;
            iVar16 = (iVar19 + -1 + scale) * iVar1;
            iVar26 = (iVar19 + -1) * iVar1;
            iVar19 = (iVar19 + -1 + iVar20) * iVar1;
            do {
              iVar27 = (int)lVar34;
              auVar106._0_4_ = (float)(iVar27 + -0xc);
              auVar120._4_12_ = auVar121._4_12_;
              auVar106._4_12_ = auVar120._4_12_;
              auVar79 = vfmadd213ss_fma(auVar106,auVar82,ZEXT416((uint)fVar3));
              iVar38 = (int)auVar79._0_4_;
              auVar107._0_4_ = (float)(iVar27 + -0xb);
              auVar107._4_12_ = auVar120._4_12_;
              auVar79 = vfmadd213ss_fma(auVar107,auVar82,ZEXT416((uint)fVar3));
              iVar56 = iVar38 + -1 + scale;
              iVar64 = iVar38 + -1 + iVar20;
              iVar28 = (int)auVar79._0_4_;
              auVar108._0_4_ = (float)(iVar27 + -10);
              auVar108._4_12_ = auVar120._4_12_;
              auVar80 = ZEXT416((uint)fVar3);
              auVar79 = vfmadd213ss_fma(auVar108,auVar82,auVar80);
              iVar31 = (int)auVar79._0_4_;
              auVar109._0_4_ = (float)(iVar27 + -9);
              auVar109._4_12_ = auVar120._4_12_;
              auVar79 = vfmadd213ss_fma(auVar109,auVar82,auVar80);
              iVar36 = (int)auVar79._0_4_;
              auVar110._0_4_ = (float)(iVar27 + -8);
              auVar110._4_12_ = auVar120._4_12_;
              auVar79 = vfmadd213ss_fma(auVar110,auVar82,auVar80);
              iVar29 = (int)auVar79._0_4_;
              auVar124._0_4_ = (float)(iVar27 + -7);
              auVar124._4_12_ = auVar120._4_12_;
              auVar122._0_4_ = (float)(iVar27 + -6);
              auVar122._4_12_ = auVar120._4_12_;
              auVar120._0_4_ = (float)(iVar27 + -5);
              auVar118._0_4_ = (float)(iVar27 + -4);
              auVar123 = in_ZMM10._4_12_;
              auVar118._4_12_ = auVar123;
              auVar79 = vfmadd213ss_fma(auVar124,auVar82,auVar80);
              auVar117._0_4_ = (float)(iVar27 + -3);
              auVar117._4_12_ = auVar123;
              auVar86 = ZEXT416((uint)fVar3);
              auVar80 = vfmadd213ss_fma(auVar122,auVar82,auVar86);
              auVar114._0_4_ = (float)(iVar27 + -2);
              auVar114._4_12_ = auVar123;
              auVar81 = vfmadd213ss_fma(auVar120,auVar82,auVar86);
              auVar111._0_4_ = (float)(iVar27 + -1);
              auVar111._4_12_ = auVar123;
              auVar83 = vfmadd213ss_fma(auVar118,auVar82,auVar86);
              auVar84 = vfmadd213ss_fma(auVar117,auVar82,auVar86);
              auVar85 = vfmadd213ss_fma(auVar114,auVar82,auVar86);
              auVar86 = vfmadd213ss_fma(auVar111,ZEXT416((uint)fVar94),auVar86);
              fVar93 = pfVar63[iVar25 + -1 + iVar38];
              fVar97 = pfVar63[iVar17 + iVar64];
              iVar58 = iVar28 + -1 + scale;
              iVar69 = iVar28 + -1 + iVar20;
              auVar89 = SUB6416(ZEXT464(0x40000000),0);
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar38] -
                                                      pfVar63[iVar18 + iVar64])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar64] -
                                                      pfVar63[iVar17 + -1 + iVar38])));
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar56] -
                                                      pfVar63[iVar25 + iVar56])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar64] -
                                                      pfVar63[iVar17 + -1 + iVar38])));
              pfVar62[lVar34 + -0x23] = (fVar93 - fVar97) + auVar88._0_4_;
              pfVar65[lVar34 + -0x23] = auVar87._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar25 + -1 + iVar28];
              fVar97 = pfVar63[iVar17 + iVar69];
              iVar59 = iVar31 + -1 + scale;
              iVar76 = iVar31 + -1 + iVar20;
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar58] -
                                                      pfVar63[iVar25 + iVar58])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar69] -
                                                      pfVar63[iVar17 + -1 + iVar28])));
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar28] -
                                                      pfVar63[iVar18 + iVar69])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar69] -
                                                      pfVar63[iVar17 + -1 + iVar28])));
              pfVar62[lVar34 + -0x22] = (fVar93 - fVar97) + auVar87._0_4_;
              pfVar65[lVar34 + -0x22] = auVar88._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar25 + -1 + iVar31];
              fVar97 = pfVar63[iVar17 + iVar76];
              iVar60 = iVar36 + -1 + iVar20;
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar31] -
                                                      pfVar63[iVar18 + iVar76])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar76] -
                                                      pfVar63[iVar17 + -1 + iVar31])));
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar59] -
                                                      pfVar63[iVar25 + iVar59])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar76] -
                                                      pfVar63[iVar17 + -1 + iVar31])));
              pfVar62[lVar34 + -0x21] = (fVar93 - fVar97) + auVar88._0_4_;
              pfVar65[lVar34 + -0x21] = auVar87._0_4_ - (fVar93 - fVar97);
              iVar39 = iVar36 + -1 + scale;
              fVar93 = pfVar63[iVar25 + -1 + iVar36];
              fVar97 = pfVar63[iVar17 + iVar60];
              iVar40 = iVar29 + -1 + scale;
              iVar73 = iVar29 + -1 + iVar20;
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar39] -
                                                      pfVar63[iVar25 + iVar39])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar60] -
                                                      pfVar63[iVar17 + -1 + iVar36])));
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar36] -
                                                      pfVar63[iVar18 + iVar60])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar60] -
                                                      pfVar63[iVar17 + -1 + iVar36])));
              pfVar62[lVar34 + -0x20] = (fVar93 - fVar97) + auVar87._0_4_;
              pfVar65[lVar34 + -0x20] = auVar88._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar25 + -1 + iVar29];
              fVar97 = pfVar63[iVar17 + iVar73];
              iVar72 = (int)auVar79._0_4_;
              iVar41 = iVar72 + -1 + scale;
              iVar57 = iVar72 + -1 + iVar20;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar40] -
                                                      pfVar63[iVar25 + iVar40])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar73] -
                                                      pfVar63[iVar17 + -1 + iVar29])));
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar29] -
                                                      pfVar63[iVar18 + iVar73])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar73] -
                                                      pfVar63[iVar17 + -1 + iVar29])));
              pfVar62[lVar34 + -0x1f] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0x1f] = auVar87._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar25 + -1 + iVar72];
              iVar49 = (int)auVar80._0_4_;
              fVar97 = pfVar63[iVar17 + iVar57];
              iVar42 = iVar49 + -1 + scale;
              iVar43 = iVar49 + -1 + iVar20;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar41] -
                                                      pfVar63[iVar25 + iVar41])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar57] -
                                                      pfVar63[iVar17 + -1 + iVar72])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar72] -
                                                      pfVar63[iVar18 + iVar57])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar57] -
                                                      pfVar63[iVar17 + -1 + iVar72])));
              pfVar62[lVar34 + -0x1e] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0x1e] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar25 + -1 + iVar49];
              iVar50 = (int)auVar81._0_4_;
              fVar97 = pfVar63[iVar17 + iVar43];
              iVar61 = iVar50 + -1 + iVar20;
              iVar44 = iVar50 + -1 + scale;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar42] -
                                                      pfVar63[iVar25 + iVar42])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar43] -
                                                      pfVar63[iVar17 + -1 + iVar49])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar49] -
                                                      pfVar63[iVar18 + iVar43])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar43] -
                                                      pfVar63[iVar17 + -1 + iVar49])));
              pfVar62[lVar34 + -0x1d] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0x1d] = auVar80._0_4_ - (fVar93 - fVar97);
              iVar51 = (int)auVar83._0_4_;
              fVar93 = pfVar63[iVar25 + -1 + iVar50];
              iVar45 = iVar51 + -1 + scale;
              fVar103 = pfVar63[iVar25 + iVar61] - pfVar63[iVar17 + -1 + iVar50];
              in_ZMM10 = ZEXT464((uint)fVar103);
              fVar97 = pfVar63[iVar17 + iVar61];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar44] -
                                                      pfVar63[iVar25 + iVar44])),auVar89,
                                        ZEXT416((uint)fVar103));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar50] -
                                                      pfVar63[iVar18 + iVar61])),auVar89,
                                        ZEXT416((uint)fVar103));
              pfVar62[lVar34 + -0x1c] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0x1c] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar25 + -1 + iVar51];
              iVar22 = iVar51 + -1 + iVar20;
              iVar52 = (int)auVar84._0_4_;
              fVar97 = pfVar63[iVar17 + iVar22];
              iVar46 = iVar52 + -1 + scale;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar45] -
                                                      pfVar63[iVar25 + iVar45])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar22] -
                                                      pfVar63[iVar17 + -1 + iVar51])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar51] -
                                                      pfVar63[iVar18 + iVar22])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar22] -
                                                      pfVar63[iVar17 + -1 + iVar51])));
              pfVar62[lVar34 + -0x1b] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0x1b] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar25 + -1 + iVar52];
              iVar37 = iVar52 + -1 + iVar20;
              fVar103 = pfVar63[iVar25 + iVar37] - pfVar63[iVar17 + -1 + iVar52];
              in_ZMM8 = ZEXT464((uint)fVar103);
              fVar97 = pfVar63[iVar17 + iVar37];
              iVar53 = (int)auVar85._0_4_;
              iVar47 = iVar53 + -1 + scale;
              iVar48 = iVar53 + -1 + iVar20;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar46] -
                                                      pfVar63[iVar25 + iVar46])),auVar89,
                                        ZEXT416((uint)fVar103));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar52] -
                                                      pfVar63[iVar18 + iVar37])),auVar89,
                                        ZEXT416((uint)fVar103));
              pfVar62[lVar34 + -0x1a] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0x1a] = auVar80._0_4_ - (fVar93 - fVar97);
              iVar54 = (int)auVar86._0_4_;
              fVar93 = pfVar63[iVar25 + -1 + iVar53];
              fVar103 = pfVar63[iVar25 + iVar48] - pfVar63[iVar17 + -1 + iVar53];
              auVar121 = ZEXT464((uint)fVar103);
              fVar97 = pfVar63[iVar17 + iVar48];
              iVar75 = iVar54 + -1 + scale;
              iVar74 = iVar54 + -1 + iVar20;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar47] -
                                                      pfVar63[iVar25 + iVar47])),auVar89,
                                        ZEXT416((uint)fVar103));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar53] -
                                                      pfVar63[iVar18 + iVar48])),auVar89,
                                        ZEXT416((uint)fVar103));
              pfVar62[lVar34 + -0x19] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0x19] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar25 + -1 + iVar54];
              fVar97 = pfVar63[iVar17 + iVar74];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar17 + iVar75] -
                                                      pfVar63[iVar25 + iVar75])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar74] -
                                                      pfVar63[iVar17 + -1 + iVar54])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar18 + -1 + iVar54] -
                                                      pfVar63[iVar18 + iVar74])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar25 + iVar74] -
                                                      pfVar63[iVar17 + -1 + iVar54])));
              pfVar62[lVar34 + -0x18] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0x18] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar38];
              fVar97 = pfVar63[iVar26 + iVar64];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar56] -
                                                      pfVar63[iVar56 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar64 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar38])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar38] -
                                                      pfVar63[iVar16 + iVar64])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar64 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar38])));
              pfVar62[lVar34 + -0xb] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -0xb] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar28];
              fVar97 = pfVar63[iVar26 + iVar69];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar58] -
                                                      pfVar63[iVar58 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar69 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar28])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar28] -
                                                      pfVar63[iVar16 + iVar69])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar69 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar28])));
              pfVar62[lVar34 + -10] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -10] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar31];
              fVar97 = pfVar63[iVar26 + iVar76];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar59] -
                                                      pfVar63[iVar59 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar76 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar31])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar31] -
                                                      pfVar63[iVar16 + iVar76])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar76 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar31])));
              pfVar62[lVar34 + -9] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -9] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar36];
              fVar97 = pfVar63[iVar26 + iVar60];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar39] -
                                                      pfVar63[iVar39 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar60 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar36])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar36] -
                                                      pfVar63[iVar16 + iVar60])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar60 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar36])));
              pfVar62[lVar34 + -8] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -8] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar29];
              fVar97 = pfVar63[iVar26 + iVar73];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar40] -
                                                      pfVar63[iVar40 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar73 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar29])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar29] -
                                                      pfVar63[iVar16 + iVar73])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar73 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar29])));
              pfVar62[lVar34 + -7] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -7] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar72];
              fVar97 = pfVar63[iVar26 + iVar57];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar41] -
                                                      pfVar63[iVar41 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar57 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar72])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar72] -
                                                      pfVar63[iVar16 + iVar57])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar57 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar72])));
              pfVar62[lVar34 + -6] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -6] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar49];
              fVar97 = pfVar63[iVar26 + iVar43];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar42] -
                                                      pfVar63[iVar42 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar43 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar49])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar49] -
                                                      pfVar63[iVar16 + iVar43])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar43 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar49])));
              pfVar62[lVar34 + -5] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -5] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar50];
              fVar97 = pfVar63[iVar26 + iVar61];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar44] -
                                                      pfVar63[iVar44 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar61 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar50])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar50] -
                                                      pfVar63[iVar16 + iVar61])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar61 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar50])));
              pfVar62[lVar34 + -4] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34 + -4] = auVar80._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar51];
              fVar97 = pfVar63[iVar26 + iVar22];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar51] -
                                                      pfVar63[iVar16 + iVar22])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar22 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar51])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar45] -
                                                      pfVar63[iVar45 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar22 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar51])));
              pfVar62[lVar34 + -3] = (fVar93 - fVar97) + auVar80._0_4_;
              pfVar65[lVar34 + -3] = auVar79._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar52];
              fVar97 = pfVar63[iVar26 + iVar37];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar52] -
                                                      pfVar63[iVar16 + iVar37])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar37 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar52])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar46] -
                                                      pfVar63[iVar46 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar37 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar52])));
              pfVar62[lVar34 + -2] = (fVar93 - fVar97) + auVar80._0_4_;
              pfVar65[lVar34 + -2] = auVar79._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar53];
              fVar97 = pfVar63[iVar26 + iVar48];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar53] -
                                                      pfVar63[iVar16 + iVar48])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar48 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar53])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar47] -
                                                      pfVar63[iVar47 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar48 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar53])));
              pfVar62[lVar34 + -1] = (fVar93 - fVar97) + auVar80._0_4_;
              pfVar65[lVar34 + -1] = auVar79._0_4_ - (fVar93 - fVar97);
              fVar93 = pfVar63[iVar19 + -1 + iVar54];
              fVar97 = pfVar63[iVar26 + iVar74];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar26 + iVar75] -
                                                      pfVar63[iVar75 + iVar19])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar74 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar54])));
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar16 + -1 + iVar54] -
                                                      pfVar63[iVar16 + iVar74])),auVar89,
                                        ZEXT416((uint)(pfVar63[iVar74 + iVar19] -
                                                      pfVar63[iVar26 + -1 + iVar54])));
              pfVar62[lVar34] = (fVar93 - fVar97) + auVar79._0_4_;
              pfVar65[lVar34] = auVar80._0_4_ - (fVar93 - fVar97);
              lVar34 = lVar34 + 0xc;
            } while (iVar27 + -0xc < 0);
            pfVar62 = pfVar62 + 0x30;
            pfVar65 = pfVar65 + 0x30;
            bVar77 = (int)uVar21 < 10;
            uVar21 = uVar21 + 2;
          } while (bVar77);
          goto LAB_001c7be9;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar34 = 0;
  uVar21 = 0xfffffff4;
  do {
    auVar95._0_4_ = (float)(int)uVar21;
    auVar95._4_12_ = in_ZMM8._4_12_;
    auVar79 = vfmadd213ss_fma(auVar95,auVar128._0_16_,ZEXT416((uint)fVar127));
    auVar98._0_4_ = (float)(int)(uVar21 | 1);
    auVar98._4_12_ = in_ZMM8._4_12_;
    fVar93 = auVar79._0_4_;
    auVar79 = vfmadd213ss_fma(auVar98,auVar128._0_16_,ZEXT416((uint)fVar127));
    fVar97 = auVar79._0_4_;
    iVar16 = (int)((double)((ulong)(0.0 <= fVar93) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar93) * -0x4020000000000000) + (double)fVar93);
    iVar25 = iVar1 + iVar16;
    iVar36 = iVar16 + -1;
    iVar26 = iVar16 + -1 + scale;
    iVar17 = iVar1 + -1 + iVar16;
    iVar31 = (int)((double)((ulong)(0.0 <= fVar97) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar97) * -0x4020000000000000) + (double)fVar97);
    iVar18 = iVar31 + -1;
    iVar27 = iVar1 + iVar31;
    iVar19 = iVar1 + -1 + iVar31;
    iVar28 = iVar31 + -1 + scale;
    lVar33 = lVar34;
    iVar20 = -0xc;
    do {
      pfVar65 = haarResponseY;
      pfVar62 = haarResponseX;
      auVar96._0_4_ = (float)iVar20;
      auVar123 = in_ZMM8._4_12_;
      auVar96._4_12_ = auVar123;
      auVar83 = auVar128._0_16_;
      auVar79 = vfmadd213ss_fma(auVar96,auVar83,auVar81);
      auVar116._0_4_ = (float)(iVar20 + 1);
      auVar116._4_12_ = auVar123;
      auVar104._0_4_ = (float)(iVar20 + 2);
      auVar104._4_12_ = auVar123;
      auVar101._0_4_ = (float)(iVar20 + 3);
      auVar101._4_12_ = auVar123;
      auVar80 = vfmadd213ss_fma(auVar104,auVar83,auVar81);
      auVar82 = vfmadd213ss_fma(auVar116,auVar83,auVar81);
      auVar83 = vfmadd213ss_fma(auVar101,auVar83,auVar81);
      fVar93 = auVar79._0_4_;
      fVar103 = auVar80._0_4_;
      fVar97 = auVar83._0_4_;
      fVar115 = auVar82._0_4_;
      pfVar63 = (float *)((long)haarResponseY + lVar33);
      iVar29 = (int)((double)((ulong)(0.0 <= fVar93) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar93) * -0x4020000000000000) + (double)fVar93);
      if (((iVar16 < 1) || (iVar29 < 1)) || (iimage->height < iVar25)) {
LAB_001c5d6b:
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar29,scale,(float *)((long)haarResponseX + lVar33),pfVar63);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar22 = iimage->width;
        iVar37 = iVar1 + iVar29;
        if (iVar22 < iVar37) goto LAB_001c5d6b;
        iVar38 = iimage->data_width;
        iVar41 = iVar29 + -1 + scale;
        pfVar15 = iimage->data;
        iVar40 = iVar38 * iVar36;
        iVar39 = iVar38 * iVar17;
        fVar93 = pfVar15[iVar39 + -1 + iVar29];
        fVar100 = pfVar15[iVar40 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar15[iVar40 + iVar41] - pfVar15[iVar39 + iVar41]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar15[iVar39 + -1 + iVar37] -
                                                pfVar15[iVar40 + -1 + iVar29])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar15[iVar38 * iVar26 + -1 + iVar29] -
                                                pfVar15[iVar38 * iVar26 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar15[iVar39 + -1 + iVar37] -
                                                pfVar15[iVar40 + -1 + iVar29])));
        *(float *)((long)haarResponseX + lVar33) = (fVar93 - fVar100) + auVar79._0_4_;
        *pfVar63 = auVar80._0_4_ - (fVar93 - fVar100);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 4);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 4);
      iVar37 = (int)((double)((ulong)(0.0 <= fVar115) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar115) * -0x4020000000000000) + (double)fVar115);
      if (((iVar16 < 1) || (iVar37 < 1)) ||
         ((iimage->height < iVar25 || (iVar38 = iVar1 + iVar37, iVar22 < iVar38)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar37,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar39 = iimage->data_width;
        iVar41 = iVar37 + -1 + scale;
        pfVar2 = iimage->data;
        iVar40 = iVar39 * iVar36;
        iVar42 = iVar39 * iVar17;
        fVar93 = pfVar2[iVar42 + -1 + iVar37];
        fVar115 = pfVar2[iVar40 + -1 + iVar38];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar40 + iVar41] - pfVar2[iVar42 + iVar41]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar42 + -1 + iVar38] -
                                                pfVar2[iVar40 + -1 + iVar37])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar39 * iVar26 + -1 + iVar37] -
                                                pfVar2[iVar39 * iVar26 + -1 + iVar38])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar42 + -1 + iVar38] -
                                                pfVar2[iVar40 + -1 + iVar37])));
        *pfVar63 = (fVar93 - fVar115) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar115);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 8);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 8);
      iVar38 = (int)((double)((ulong)(0.0 <= fVar103) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar103) * -0x4020000000000000) + (double)fVar103);
      if (((iVar16 < 1) || (iVar38 < 1)) ||
         ((iimage->height < iVar25 || (iVar39 = iVar1 + iVar38, iVar22 < iVar39)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar38,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        iVar42 = iVar38 + -1 + scale;
        pfVar2 = iimage->data;
        iVar41 = iVar40 * iVar36;
        iVar43 = iVar40 * iVar17;
        fVar93 = pfVar2[iVar43 + -1 + iVar38];
        fVar103 = pfVar2[iVar41 + -1 + iVar39];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar41 + iVar42] - pfVar2[iVar43 + iVar42]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar43 + -1 + iVar39] -
                                                pfVar2[iVar41 + -1 + iVar38])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar40 * iVar26 + -1 + iVar38] -
                                                pfVar2[iVar40 * iVar26 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar43 + -1 + iVar39] -
                                                pfVar2[iVar41 + -1 + iVar38])));
        *pfVar63 = (fVar93 - fVar103) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar103);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0xc);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0xc);
      iVar39 = (int)((double)((ulong)(0.0 <= fVar97) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar97) * -0x4020000000000000) + (double)fVar97);
      if ((((iVar16 < 1) || (iVar39 < 1)) || (iimage->height < iVar25)) ||
         (iVar40 = iVar1 + iVar39, iVar22 < iVar40)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar39,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar41 = iimage->data_width;
        iVar43 = iVar39 + -1 + scale;
        pfVar2 = iimage->data;
        iVar42 = iVar41 * iVar36;
        iVar44 = iVar41 * iVar17;
        fVar93 = pfVar2[iVar44 + -1 + iVar39];
        fVar97 = pfVar2[iVar42 + -1 + iVar40];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar42 + iVar43] - pfVar2[iVar44 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar44 + -1 + iVar40] -
                                                pfVar2[iVar42 + -1 + iVar39])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar41 * iVar26 + -1 + iVar39] -
                                                pfVar2[iVar41 * iVar26 + -1 + iVar40])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar44 + -1 + iVar40] -
                                                pfVar2[iVar42 + -1 + iVar39])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x10);
      auVar91 = vpbroadcastd_avx512vl();
      auVar91 = vpaddd_avx2(auVar91,_DAT_005997c0);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x10);
      auVar91 = vcvtdq2ps_avx(auVar91);
      auVar13._4_4_ = fVar3;
      auVar13._0_4_ = fVar3;
      auVar13._8_4_ = fVar3;
      auVar13._12_4_ = fVar3;
      auVar13._16_4_ = fVar3;
      auVar13._20_4_ = fVar3;
      auVar13._24_4_ = fVar3;
      auVar13._28_4_ = fVar3;
      auVar14._4_4_ = fVar94;
      auVar14._0_4_ = fVar94;
      auVar14._8_4_ = fVar94;
      auVar14._12_4_ = fVar94;
      auVar14._16_4_ = fVar94;
      auVar14._20_4_ = fVar94;
      auVar14._24_4_ = fVar94;
      auVar14._28_4_ = fVar94;
      auVar80 = vfmadd132ps_fma(auVar91,auVar13,auVar14);
      auVar79 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xff);
      uVar23 = vcmpps_avx512vl(ZEXT1632(auVar80),_DAT_005997e0,0xd);
      bVar77 = (bool)((byte)(uVar23 >> 7) & 1);
      iVar40 = (int)((double)((ulong)bVar77 * 0x3fe0000000000000 +
                             (ulong)!bVar77 * -0x4020000000000000) + (double)auVar79._0_4_);
      if (((iVar16 < 1) || (iVar40 < 1)) ||
         ((iimage->height < iVar25 || (iVar41 = iVar1 + iVar40, iVar22 < iVar41)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar40,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar42 = iimage->data_width;
        iVar45 = iVar40 + -1 + scale;
        pfVar2 = iimage->data;
        iVar44 = iVar42 * iVar36;
        iVar43 = iVar42 * iVar17;
        fVar93 = pfVar2[iVar43 + -1 + iVar40];
        fVar97 = pfVar2[iVar44 + -1 + iVar41];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar44 + iVar45] - pfVar2[iVar43 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar43 + -1 + iVar41] -
                                                pfVar2[iVar44 + -1 + iVar40])));
        auVar82 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar42 * iVar26 + -1 + iVar40] -
                                                pfVar2[iVar42 * iVar26 + -1 + iVar41])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar43 + -1 + iVar41] -
                                                pfVar2[iVar44 + -1 + iVar40])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar82._0_4_ - (fVar93 - fVar97);
      }
      auVar79 = vpermilpd_avx((undefined1  [16])0x0,1);
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x14);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x14);
      bVar78 = (byte)uVar23;
      iVar41 = (int)((double)((ulong)(bVar78 >> 6 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 6 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      if (((iVar16 < 1) || (iVar41 < 1)) ||
         ((iimage->height < iVar25 || (iVar42 = iVar1 + iVar41, iVar22 < iVar42)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar41,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar43 = iimage->data_width;
        iVar46 = iVar41 + -1 + scale;
        pfVar2 = iimage->data;
        iVar45 = iVar43 * iVar36;
        iVar44 = iVar43 * iVar17;
        fVar93 = pfVar2[iVar44 + -1 + iVar41];
        fVar97 = pfVar2[iVar45 + -1 + iVar42];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 + iVar46] - pfVar2[iVar44 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar44 + -1 + iVar42] -
                                                pfVar2[iVar45 + -1 + iVar41])));
        auVar82 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar43 * iVar26 + -1 + iVar41] -
                                                pfVar2[iVar43 * iVar26 + -1 + iVar42])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar44 + -1 + iVar42] -
                                                pfVar2[iVar45 + -1 + iVar41])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar82._0_4_ - (fVar93 - fVar97);
      }
      auVar79 = vmovshdup_avx((undefined1  [16])0x0);
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x18);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x18);
      iVar42 = (int)((double)((ulong)(bVar78 >> 5 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 5 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      if ((((iVar16 < 1) || (iVar42 < 1)) || (iimage->height < iVar25)) ||
         (iVar43 = iVar1 + iVar42, iVar22 < iVar43)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar42,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar44 = iimage->data_width;
        iVar47 = iVar42 + -1 + scale;
        pfVar2 = iimage->data;
        iVar46 = iVar44 * iVar36;
        iVar45 = iVar44 * iVar17;
        fVar93 = pfVar2[iVar45 + -1 + iVar42];
        fVar97 = pfVar2[iVar46 + -1 + iVar43];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 + iVar47] - pfVar2[iVar45 + iVar47]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar45 + -1 + iVar43] -
                                                pfVar2[iVar46 + -1 + iVar42])));
        auVar82 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar44 * iVar26 + -1 + iVar42] -
                                                pfVar2[iVar44 * iVar26 + -1 + iVar43])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar45 + -1 + iVar43] -
                                                pfVar2[iVar46 + -1 + iVar42])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar82._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x1c);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x1c);
      iVar43 = (int)((double)((ulong)(bVar78 >> 4 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 4 & 1) * -0x4020000000000000) + 0.0);
      if (((iVar16 < 1) || (iVar43 < 1)) ||
         ((iimage->height < iVar25 || (iVar44 = iVar1 + iVar43, iVar22 < iVar44)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar43,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar45 = iimage->data_width;
        iVar48 = iVar43 + -1 + scale;
        pfVar2 = iimage->data;
        iVar47 = iVar45 * iVar36;
        iVar46 = iVar45 * iVar17;
        fVar93 = pfVar2[iVar46 + -1 + iVar43];
        fVar97 = pfVar2[iVar47 + -1 + iVar44];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar47 + iVar48] - pfVar2[iVar46 + iVar48]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar46 + -1 + iVar44] -
                                                pfVar2[iVar47 + -1 + iVar43])));
        auVar82 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar26 + -1 + iVar43] -
                                                pfVar2[iVar45 * iVar26 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar46 + -1 + iVar44] -
                                                pfVar2[iVar47 + -1 + iVar43])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar82._0_4_ - (fVar93 - fVar97);
      }
      auVar79 = vpermilps_avx(auVar80,0xff);
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x20);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x20);
      iVar44 = (int)((double)((ulong)(bVar78 >> 3 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 3 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      if (((iVar16 < 1) || (iVar44 < 1)) ||
         ((iimage->height < iVar25 || (iVar45 = iVar1 + iVar44, iVar22 < iVar45)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar44,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar46 = iimage->data_width;
        iVar75 = iVar44 + -1 + scale;
        pfVar2 = iimage->data;
        iVar48 = iVar46 * iVar36;
        iVar47 = iVar46 * iVar17;
        fVar93 = pfVar2[iVar47 + -1 + iVar44];
        fVar97 = pfVar2[iVar48 + -1 + iVar45];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar48 + iVar75] - pfVar2[iVar47 + iVar75]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar47 + -1 + iVar45] -
                                                pfVar2[iVar48 + -1 + iVar44])));
        auVar82 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar26 + -1 + iVar44] -
                                                pfVar2[iVar46 * iVar26 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar47 + -1 + iVar45] -
                                                pfVar2[iVar48 + -1 + iVar44])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar82._0_4_ - (fVar93 - fVar97);
      }
      auVar79 = vpermilpd_avx(auVar80,1);
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x24);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x24);
      iVar45 = (int)((double)((ulong)(bVar78 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      if ((((iVar16 < 1) || (iVar45 < 1)) || (iimage->height < iVar25)) ||
         (iVar46 = iVar1 + iVar45, iVar22 < iVar46)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar45,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar47 = iimage->data_width;
        iVar74 = iVar45 + -1 + scale;
        pfVar2 = iimage->data;
        iVar75 = iVar47 * iVar36;
        iVar48 = iVar47 * iVar17;
        fVar93 = pfVar2[iVar48 + -1 + iVar45];
        fVar97 = pfVar2[iVar75 + -1 + iVar46];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar75 + iVar74] - pfVar2[iVar48 + iVar74]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar48 + -1 + iVar46] -
                                                pfVar2[iVar75 + -1 + iVar45])));
        auVar82 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar47 * iVar26 + -1 + iVar45] -
                                                pfVar2[iVar47 * iVar26 + -1 + iVar46])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar48 + -1 + iVar46] -
                                                pfVar2[iVar75 + -1 + iVar45])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar82._0_4_ - (fVar93 - fVar97);
      }
      auVar79 = vmovshdup_avx(auVar80);
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x28);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x28);
      iVar46 = (int)((double)((ulong)(bVar78 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      if (((iVar16 < 1) || (iVar46 < 1)) ||
         ((iimage->height < iVar25 || (iVar47 = iVar1 + iVar46, iVar22 < iVar47)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar46,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar48 = iimage->data_width;
        iVar73 = iVar46 + -1 + scale;
        pfVar2 = iimage->data;
        iVar75 = iVar48 * iVar36;
        iVar74 = iVar48 * iVar17;
        fVar93 = pfVar2[iVar74 + -1 + iVar46];
        fVar97 = pfVar2[iVar75 + -1 + iVar47];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar75 + iVar73] - pfVar2[iVar74 + iVar73]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar74 + -1 + iVar47] -
                                                pfVar2[iVar75 + -1 + iVar46])));
        auVar82 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar48 * iVar26 + -1 + iVar46] -
                                                pfVar2[iVar48 * iVar26 + -1 + iVar47])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar74 + -1 + iVar47] -
                                                pfVar2[iVar75 + -1 + iVar46])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar82._0_4_ - (fVar93 - fVar97);
      }
      local_118 = auVar80._0_4_;
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x2c);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x2c);
      iVar47 = (int)((double)((ulong)(bVar78 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 & 1) * -0x4020000000000000) + (double)local_118);
      if (((iVar16 < 1) || (iVar47 < 1)) ||
         ((iimage->height < iVar25 || (iVar48 = iVar1 + iVar47, iVar22 < iVar48)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar16,iVar47,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar75 = iimage->data_width;
        iVar73 = iVar47 + -1 + scale;
        pfVar2 = iimage->data;
        iVar74 = iVar75 * iVar36;
        iVar72 = iVar75 * iVar17;
        fVar93 = pfVar2[iVar72 + -1 + iVar47];
        fVar97 = pfVar2[iVar74 + -1 + iVar48];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar74 + iVar73] - pfVar2[iVar72 + iVar73]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar72 + -1 + iVar48] -
                                                pfVar2[iVar74 + -1 + iVar47])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar75 * iVar26 + -1 + iVar47] -
                                                pfVar2[iVar75 * iVar26 + -1 + iVar48])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar72 + -1 + iVar48] -
                                                pfVar2[iVar74 + -1 + iVar47])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x60);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x60);
      if ((((iVar31 < 1) || (iVar29 < 1)) || (iimage->height < iVar27)) ||
         (iVar48 = iVar1 + iVar29, iVar22 < iVar48)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar29,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar75 = iimage->data_width;
        iVar74 = iVar29 + -1 + scale;
        pfVar2 = iimage->data;
        iVar72 = iVar75 * iVar18;
        iVar73 = iVar75 * iVar19;
        fVar93 = pfVar2[iVar73 + -1 + iVar29];
        fVar97 = pfVar2[iVar72 + -1 + iVar48];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar72 + iVar74] - pfVar2[iVar73 + iVar74]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar73 + -1 + iVar48] -
                                                pfVar2[iVar72 + -1 + iVar29])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar75 * iVar28 + -1 + iVar29] -
                                                pfVar2[iVar75 * iVar28 + -1 + iVar48])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar73 + -1 + iVar48] -
                                                pfVar2[iVar72 + -1 + iVar29])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 100);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 100);
      if (((iVar31 < 1) || (iVar37 < 1)) ||
         ((iimage->height < iVar27 || (iVar29 = iVar1 + iVar37, iVar22 < iVar29)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar37,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar48 = iimage->data_width;
        iVar75 = iVar37 + -1 + scale;
        pfVar2 = iimage->data;
        iVar73 = iVar48 * iVar18;
        iVar74 = iVar48 * iVar19;
        fVar93 = pfVar2[iVar74 + -1 + iVar37];
        fVar97 = pfVar2[iVar73 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar73 + iVar75] - pfVar2[iVar74 + iVar75]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar74 + -1 + iVar29] -
                                                pfVar2[iVar73 + -1 + iVar37])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar48 * iVar28 + -1 + iVar37] -
                                                pfVar2[iVar48 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar74 + -1 + iVar29] -
                                                pfVar2[iVar73 + -1 + iVar37])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x68);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x68);
      if (((iVar31 < 1) || (iVar38 < 1)) ||
         ((iimage->height < iVar27 || (iVar29 = iVar1 + iVar38, iVar22 < iVar29)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar38,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar48 = iVar38 + -1 + scale;
        pfVar2 = iimage->data;
        iVar74 = iVar37 * iVar18;
        iVar75 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar75 + -1 + iVar38];
        fVar97 = pfVar2[iVar74 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar74 + iVar48] - pfVar2[iVar75 + iVar48]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar75 + -1 + iVar29] -
                                                pfVar2[iVar74 + -1 + iVar38])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar38] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar75 + -1 + iVar29] -
                                                pfVar2[iVar74 + -1 + iVar38])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x6c);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x6c);
      if ((((iVar31 < 1) || (iVar39 < 1)) || (iimage->height < iVar27)) ||
         (iVar29 = iVar1 + iVar39, iVar22 < iVar29)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar39,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar38 = iVar39 + -1 + scale;
        pfVar2 = iimage->data;
        iVar75 = iVar37 * iVar18;
        iVar48 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar48 + -1 + iVar39];
        fVar97 = pfVar2[iVar75 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar75 + iVar38] - pfVar2[iVar48 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar48 + -1 + iVar29] -
                                                pfVar2[iVar75 + -1 + iVar39])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar39] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar48 + -1 + iVar29] -
                                                pfVar2[iVar75 + -1 + iVar39])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x70);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x70);
      if (((iVar31 < 1) || (iVar40 < 1)) ||
         ((iimage->height < iVar27 || (iVar29 = iVar1 + iVar40, iVar22 < iVar29)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar40,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar38 = iVar40 + -1 + scale;
        pfVar2 = iimage->data;
        iVar48 = iVar37 * iVar18;
        iVar39 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar39 + -1 + iVar40];
        fVar97 = pfVar2[iVar48 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar48 + iVar38] - pfVar2[iVar39 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar48 + -1 + iVar40])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar40] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar48 + -1 + iVar40])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x74);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x74);
      if (((iVar31 < 1) || (iVar41 < 1)) ||
         ((iimage->height < iVar27 || (iVar29 = iVar1 + iVar41, iVar22 < iVar29)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar41,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar38 = iVar41 + -1 + scale;
        pfVar2 = iimage->data;
        iVar40 = iVar37 * iVar18;
        iVar39 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar39 + -1 + iVar41];
        fVar97 = pfVar2[iVar40 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar40 + iVar38] - pfVar2[iVar39 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar41])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar41] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar41])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x78);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x78);
      if ((((iVar31 < 1) || (iVar42 < 1)) || (iimage->height < iVar27)) ||
         (iVar29 = iVar1 + iVar42, iVar22 < iVar29)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar42,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar38 = iVar42 + -1 + scale;
        pfVar2 = iimage->data;
        iVar40 = iVar37 * iVar18;
        iVar39 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar39 + -1 + iVar42];
        fVar97 = pfVar2[iVar40 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar40 + iVar38] - pfVar2[iVar39 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar42])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar42] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar42])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x7c);
      pfVar15 = (float *)((long)pfVar65 + lVar33 + 0x7c);
      if (((iVar31 < 1) || (iVar43 < 1)) ||
         ((iimage->height < iVar27 || (iVar29 = iVar1 + iVar43, iVar22 < iVar29)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar43,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar38 = iVar43 + -1 + scale;
        pfVar2 = iimage->data;
        iVar40 = iVar37 * iVar18;
        iVar39 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar39 + -1 + iVar43];
        fVar97 = pfVar2[iVar40 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar40 + iVar38] - pfVar2[iVar39 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar43])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar43] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar43])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x80);
      pfVar15 = (float *)(lVar33 + 0x80 + (long)pfVar65);
      if (((iVar31 < 1) || (iVar44 < 1)) ||
         ((iimage->height < iVar27 || (iVar29 = iVar1 + iVar44, iVar22 < iVar29)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar44,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar38 = iVar44 + -1 + scale;
        pfVar2 = iimage->data;
        iVar40 = iVar37 * iVar18;
        iVar39 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar39 + -1 + iVar44];
        fVar97 = pfVar2[iVar40 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar40 + iVar38] - pfVar2[iVar39 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar44])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar44] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar44])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x84);
      pfVar15 = (float *)(lVar33 + 0x84 + (long)pfVar65);
      if ((((iVar31 < 1) || (iVar45 < 1)) || (iimage->height < iVar27)) ||
         (iVar29 = iVar1 + iVar45, iVar22 < iVar29)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar45,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar38 = iVar45 + -1 + scale;
        pfVar2 = iimage->data;
        iVar40 = iVar37 * iVar18;
        iVar39 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar39 + -1 + iVar45];
        fVar97 = pfVar2[iVar40 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar40 + iVar38] - pfVar2[iVar39 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar45])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar45] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar45])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar63 = (float *)((long)pfVar62 + lVar33 + 0x88);
      pfVar15 = (float *)(lVar33 + 0x88 + (long)pfVar65);
      if (((iVar31 < 1) || (iVar46 < 1)) ||
         ((iimage->height < iVar27 || (iVar29 = iVar1 + iVar46, iVar22 < iVar29)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar46,scale,pfVar63,pfVar15);
        iVar22 = iimage->width;
        pfVar62 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar38 = iVar46 + -1 + scale;
        pfVar2 = iimage->data;
        iVar40 = iVar37 * iVar18;
        iVar39 = iVar37 * iVar19;
        fVar93 = pfVar2[iVar39 + -1 + iVar46];
        fVar97 = pfVar2[iVar40 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar40 + iVar38] - pfVar2[iVar39 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar46])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 * iVar28 + -1 + iVar46] -
                                                pfVar2[iVar37 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar29] -
                                                pfVar2[iVar40 + -1 + iVar46])));
        *pfVar63 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar15 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      pfVar62 = (float *)((long)pfVar62 + lVar33 + 0x8c);
      pfVar65 = (float *)((long)pfVar65 + lVar33 + 0x8c);
      if (((iVar31 < 1) || (iVar47 < 1)) ||
         ((iimage->height < iVar27 || (iVar29 = iVar1 + iVar47, iVar22 < iVar29)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar31,iVar47,scale,pfVar62,pfVar65);
      }
      else {
        iVar22 = iimage->data_width;
        pfVar63 = iimage->data;
        iVar37 = iVar47 + -1 + scale;
        iVar39 = iVar22 * iVar18;
        iVar38 = iVar22 * iVar19;
        fVar93 = pfVar63[iVar38 + -1 + iVar47];
        fVar97 = pfVar63[iVar39 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar39 + iVar37] - pfVar63[iVar38 + iVar37]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar63[iVar38 + -1 + iVar29] -
                                                pfVar63[iVar39 + -1 + iVar47])));
        auVar80 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar22 * iVar28 + -1 + iVar47] -
                                                pfVar63[iVar22 * iVar28 + -1 + iVar29])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar63[iVar38 + -1 + iVar29] -
                                                pfVar63[iVar39 + -1 + iVar47])));
        *pfVar62 = (fVar93 - fVar97) + auVar79._0_4_;
        *pfVar65 = auVar80._0_4_ - (fVar93 - fVar97);
      }
      auVar128 = ZEXT1664(ZEXT416((uint)fVar94));
      lVar33 = lVar33 + 0x30;
      bVar77 = iVar20 < 0;
      iVar20 = iVar20 + 0xc;
    } while (bVar77);
    lVar34 = lVar34 + 0xc0;
    bVar77 = (int)uVar21 < 10;
    uVar21 = uVar21 + 2;
  } while (bVar77);
LAB_001c7be9:
  fVar127 = auVar128._0_4_;
  auVar126._8_4_ = 0x3effffff;
  auVar126._0_8_ = 0x3effffff3effffff;
  auVar126._12_4_ = 0x3effffff;
  auVar125._8_4_ = 0x80000000;
  auVar125._0_8_ = 0x8000000080000000;
  auVar125._12_4_ = 0x80000000;
  auVar79 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 0.5)),auVar125,0xf8);
  auVar79 = ZEXT416((uint)(fVar127 * 0.5 + auVar79._0_4_));
  auVar79 = vroundss_avx(auVar79,auVar79,0xb);
  auVar80 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 1.5)),auVar125,0xf8);
  auVar80 = ZEXT416((uint)(fVar127 * 1.5 + auVar80._0_4_));
  auVar80 = vroundss_avx(auVar80,auVar80,0xb);
  auVar81 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 2.5)),auVar125,0xf8);
  auVar81 = ZEXT416((uint)(fVar127 * 2.5 + auVar81._0_4_));
  auVar81 = vroundss_avx(auVar81,auVar81,0xb);
  auVar82 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 3.5)),auVar125,0xf8);
  auVar82 = ZEXT416((uint)(fVar127 * 3.5 + auVar82._0_4_));
  auVar82 = vroundss_avx(auVar82,auVar82,0xb);
  auVar83 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 4.5)),auVar125,0xf8);
  auVar83 = ZEXT416((uint)(fVar127 * 4.5 + auVar83._0_4_));
  auVar83 = vroundss_avx(auVar83,auVar83,0xb);
  auVar84 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 5.5)),auVar125,0xf8);
  auVar84 = ZEXT416((uint)(fVar127 * 5.5 + auVar84._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  auVar85 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 6.5)),auVar125,0xf8);
  auVar85 = ZEXT416((uint)(fVar127 * 6.5 + auVar85._0_4_));
  auVar85 = vroundss_avx(auVar85,auVar85,0xb);
  auVar86 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 7.5)),auVar125,0xf8);
  auVar86 = ZEXT416((uint)(auVar86._0_4_ + fVar127 * 7.5));
  auVar86 = vroundss_avx(auVar86,auVar86,0xb);
  auVar87 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 8.5)),auVar125,0xf8);
  auVar87 = ZEXT416((uint)(fVar127 * 8.5 + auVar87._0_4_));
  auVar87 = vroundss_avx(auVar87,auVar87,0xb);
  auVar88 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 9.5)),auVar125,0xf8);
  auVar88 = ZEXT416((uint)(fVar127 * 9.5 + auVar88._0_4_));
  auVar88 = vroundss_avx(auVar88,auVar88,0xb);
  auVar89 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 10.5)),auVar125,0xf8);
  auVar89 = ZEXT416((uint)(fVar127 * 10.5 + auVar89._0_4_));
  auVar89 = vroundss_avx(auVar89,auVar89,0xb);
  auVar90 = vpternlogd_avx512vl(auVar126,ZEXT416((uint)(fVar127 * 11.5)),auVar125,0xf8);
  fVar100 = auVar81._0_4_;
  fVar94 = fVar100 + auVar80._0_4_;
  fVar3 = fVar100 + auVar79._0_4_;
  auVar81 = ZEXT416((uint)(fVar127 * 11.5 + auVar90._0_4_));
  auVar81 = vroundss_avx(auVar81,auVar81,0xb);
  fVar127 = fVar100 - auVar79._0_4_;
  fVar93 = fVar100 - auVar80._0_4_;
  fVar97 = fVar100 - auVar82._0_4_;
  fVar103 = fVar100 - auVar83._0_4_;
  fVar115 = fVar100 - auVar84._0_4_;
  fVar100 = fVar100 - auVar85._0_4_;
  fVar119 = auVar86._0_4_;
  fVar4 = fVar119 - auVar82._0_4_;
  fVar5 = fVar119 - auVar83._0_4_;
  fVar6 = fVar119 - auVar84._0_4_;
  fVar7 = fVar119 - auVar85._0_4_;
  fVar8 = fVar119 - auVar87._0_4_;
  fVar9 = fVar119 - auVar88._0_4_;
  fVar10 = fVar119 - auVar89._0_4_;
  fVar119 = fVar119 - auVar81._0_4_;
  gauss_s1_c0[0] = expf(fVar94 * fVar94 * fVar92);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar92);
  gauss_s1_c0[2] = expf(fVar127 * fVar127 * fVar92);
  gauss_s1_c0[3] = expf(fVar93 * fVar93 * fVar92);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar97 * fVar97 * fVar92);
  gauss_s1_c0[6] = expf(fVar103 * fVar103 * fVar92);
  gauss_s1_c0[7] = expf(fVar115 * fVar115 * fVar92);
  gauss_s1_c0[8] = expf(fVar100 * fVar100 * fVar92);
  gauss_s1_c1[0] = expf(fVar4 * fVar4 * fVar92);
  gauss_s1_c1[1] = expf(fVar5 * fVar5 * fVar92);
  gauss_s1_c1[2] = expf(fVar6 * fVar6 * fVar92);
  gauss_s1_c1[3] = expf(fVar7 * fVar7 * fVar92);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar8 * fVar8 * fVar92);
  gauss_s1_c1[6] = expf(fVar9 * fVar9 * fVar92);
  gauss_s1_c1[7] = expf(fVar10 * fVar10 * fVar92);
  gauss_s1_c1[8] = expf(fVar119 * fVar119 * fVar92);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  uVar23 = 0xfffffff8;
  fVar94 = 0.0;
  lVar34 = 0;
  lVar33 = 0;
  local_200 = 0;
  do {
    pfVar63 = gauss_s1_c1;
    uVar21 = (uint)uVar23;
    if (uVar21 != 7) {
      pfVar63 = gauss_s1_c0;
    }
    lVar70 = (long)local_200;
    lVar33 = (long)(int)lVar33;
    if (uVar21 == 0xfffffff8) {
      pfVar63 = gauss_s1_c1;
    }
    uVar68 = 0;
    local_200 = local_200 + 4;
    uVar55 = 0xfffffff8;
    lVar66 = (long)haarResponseX + lVar34;
    lVar32 = (long)haarResponseY + lVar34;
    do {
      pfVar62 = gauss_s1_c1;
      if (uVar55 != 7) {
        pfVar62 = gauss_s1_c0;
      }
      auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar55 == 0xfffffff8) {
        pfVar62 = gauss_s1_c1;
      }
      uVar24 = (ulong)(uVar55 >> 0x1c & 0xfffffff8);
      uVar30 = uVar68;
      lVar35 = lVar32;
      lVar71 = lVar66;
      do {
        lVar67 = 0;
        pfVar65 = (float *)((long)pfVar63 + (ulong)(uint)((int)(uVar23 >> 0x1f) << 5));
        do {
          fVar3 = pfVar62[uVar24] * *pfVar65;
          pfVar65 = pfVar65 + (ulong)(~uVar21 >> 0x1f) * 2 + -1;
          auVar79 = vinsertps_avx(ZEXT416(*(uint *)(lVar35 + lVar67 * 4)),
                                  ZEXT416(*(uint *)(lVar71 + lVar67 * 4)),0x10);
          lVar67 = lVar67 + 1;
          auVar112._0_4_ = fVar3 * auVar79._0_4_;
          auVar112._4_4_ = fVar3 * auVar79._4_4_;
          auVar112._8_4_ = fVar3 * auVar79._8_4_;
          auVar112._12_4_ = fVar3 * auVar79._12_4_;
          auVar79 = vandps_avx(auVar112,auVar99);
          auVar79 = vmovlhps_avx(auVar112,auVar79);
          auVar102._0_4_ = auVar121._0_4_ + auVar79._0_4_;
          auVar102._4_4_ = auVar121._4_4_ + auVar79._4_4_;
          auVar102._8_4_ = auVar121._8_4_ + auVar79._8_4_;
          auVar102._12_4_ = auVar121._12_4_ + auVar79._12_4_;
          auVar121 = ZEXT1664(auVar102);
        } while (lVar67 != 9);
        uVar30 = uVar30 + 0x18;
        uVar24 = uVar24 + (ulong)(-1 < (int)uVar55) * 2 + -1;
        lVar71 = lVar71 + 0x60;
        lVar35 = lVar35 + 0x60;
      } while (uVar30 < uVar55 * 0x18 + 0x198);
      uVar55 = uVar55 + 5;
      uVar68 = uVar68 + 0x78;
      fVar3 = gauss_s2_arr[lVar70];
      auVar12._4_4_ = fVar3;
      auVar12._0_4_ = fVar3;
      auVar12._8_4_ = fVar3;
      auVar12._12_4_ = fVar3;
      auVar82 = vmulps_avx512vl(auVar102,auVar12);
      lVar70 = lVar70 + 1;
      auVar105._0_4_ = auVar82._0_4_ * auVar82._0_4_;
      auVar105._4_4_ = auVar82._4_4_ * auVar82._4_4_;
      auVar105._8_4_ = auVar82._8_4_ * auVar82._8_4_;
      auVar105._12_4_ = auVar82._12_4_ * auVar82._12_4_;
      auVar80 = vshufpd_avx(auVar82,auVar82,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar33) = auVar82;
      lVar33 = lVar33 + 4;
      lVar66 = lVar66 + 0x1e0;
      lVar32 = lVar32 + 0x1e0;
      auVar79 = vmovshdup_avx(auVar105);
      auVar81 = vfmadd231ss_fma(auVar79,auVar82,auVar82);
      auVar79 = vshufps_avx(auVar82,auVar82,0xff);
      auVar80 = vfmadd213ss_fma(auVar80,auVar80,auVar81);
      auVar79 = vfmadd213ss_fma(auVar79,auVar79,auVar80);
      fVar94 = fVar94 + auVar79._0_4_;
    } while (local_200 != (int)lVar70);
    lVar34 = lVar34 + 0x14;
    uVar23 = (ulong)(uVar21 + 5);
  } while ((int)uVar21 < 3);
  if (fVar94 < 0.0) {
    fVar94 = sqrtf(fVar94);
  }
  else {
    auVar79 = vsqrtss_avx(ZEXT416((uint)fVar94),ZEXT416((uint)fVar94));
    fVar94 = auVar79._0_4_;
  }
  lVar34 = 0;
  auVar121 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar94)));
  do {
    auVar128 = vmulps_avx512f(auVar121,*(undefined1 (*) [64])(ipoint->descriptor + lVar34));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar34) = auVar128;
    lVar34 = lVar34 + 0x10;
  } while (lVar34 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_12_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}